

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O1

int searcher_C(lua_State *L)

{
  int iVar1;
  char *name;
  char *filename;
  char *in_RCX;
  
  name = luaL_checklstring(L,1,(size_t *)0x0);
  filename = findfile(L,name,"cpath",in_RCX);
  if (filename != (char *)0x0) {
    iVar1 = loadfunc(L,filename,name);
    iVar1 = checkload(L,(uint)(iVar1 == 0),filename);
    return iVar1;
  }
  return 1;
}

Assistant:

static int searcher_C (lua_State *L) {
  const char *name = luaL_checkstring(L, 1);
  const char *filename = findfile(L, name, "cpath", LUA_CSUBSEP);
  if (filename == NULL) return 1;  /* module not found in this path */
  return checkload(L, (loadfunc(L, filename, name) == 0), filename);
}